

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void SpiritKarma<short>(void)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  char *__s;
  char buf [64];
  char *beg;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  __s = _operator_delete + (*_operator_delete == '*');
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"spirit karma",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  lVar3 = std::chrono::_V2::steady_clock::now();
  beg._6_2_ = -0x8000;
  do {
    buf[0x38] = '\0';
    buf[0x39] = '\0';
    buf[0x3a] = '\0';
    buf[0x3b] = '\0';
    buf[0x3c] = '\0';
    buf[0x3d] = '\0';
    buf[0x3e] = '\0';
    buf[0x3f] = '\0';
    boost::spirit::karma::
    any_int_generator<short,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>::
    insert_int<boost::spirit::karma::detail::output_iterator<char*,mpl_::int_<15>,boost::spirit::unused_type>,short>
              ((output_iterator<char_*,_mpl_::int_<15>,_boost::spirit::unused_type> *)(buf + 0x38),
               (short *)((long)&beg + 6));
    beg._6_2_ = beg._6_2_ + 1;
  } while (beg._6_2_ != 0x7fff);
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void SpiritKarma()
{
    char buf[64];
    PROFILING_BEGIN(T, "spirit karma")
    char *beg = buf;
    boost::spirit::karma::generate(beg, boost::spirit::karma::auto_, i);
    *beg = 0;
    PROFILING_END()
}